

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::OP_NewScArrayWithElements
              (uint32 elementCount,Var *elements,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  ThreadContext *threadContext;
  JavascriptLibrary *this;
  JavascriptArray *pJVar3;
  SparseArraySegmentBase **ppSVar4;
  SparseArraySegment<void_*> *pSVar5;
  undefined4 *puVar6;
  SparseArraySegment<void_*> *head;
  JavascriptArray *arr;
  JsReentLock reentrancylock;
  ScriptContext *scriptContext_local;
  Var *elements_local;
  uint32 elementCount_local;
  
  reentrancylock._24_8_ = scriptContext;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)&arr,threadContext);
  this = ScriptContext::GetLibrary((ScriptContext *)reentrancylock._24_8_);
  pJVar3 = JavascriptLibrary::CreateArrayLiteral(this,elementCount);
  ppSVar4 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                      ((WriteBarrierPtr *)&pJVar3->head);
  pSVar5 = SparseArraySegment<void_*>::From(*ppSVar4);
  if ((pSVar5->super_SparseArraySegmentBase).length < elementCount) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x3a0,"(elementCount <= head->length)",
                                "elementCount <= head->length");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  Memory::CopyArray<void,Memory::WriteBarrierPtr<void>,Memory::Recycler>
            ((WriteBarrierPtr<void> *)(pSVar5 + 1),
             (ulong)(pSVar5->super_SparseArraySegmentBase).length,elements,(ulong)elementCount);
  (*(pJVar3->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])();
  JsReentLock::~JsReentLock((JsReentLock *)&arr);
  return pJVar3;
}

Assistant:

Var JavascriptArray::OP_NewScArrayWithElements(uint32 elementCount, Var *elements, ScriptContext* scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(ScrArr_OP_NewScArrayWithElements, reentrancylock, scriptContext->GetThreadContext());
        // Called only to create array literals: size is known.
        JavascriptArray *arr = scriptContext->GetLibrary()->CreateArrayLiteral(elementCount);

        SparseArraySegment<Var> *head = SparseArraySegment<Var>::From(arr->head);
        Assert(elementCount <= head->length);
        CopyArray(head->elements, head->length, elements, elementCount);

#ifdef VALIDATE_ARRAY
        arr->ValidateArray();
#endif

        return arr;
        JIT_HELPER_END(ScrArr_OP_NewScArrayWithElements);
    }